

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall
ByteCodeGenerator::EnsureLetConstScopeSlots
          (ByteCodeGenerator *this,ParseNodeBlock *pnodeBlock,FuncInfo *funcInfo)

{
  byte bVar1;
  Symbol *this_00;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ParseNodeVar *pPVar5;
  ParseNodePtr this_01;
  
  bVar1 = pnodeBlock->field_0x5c;
  if ((pnodeBlock->super_ParseNodeStmt).super_ParseNode.nop != knopBlock) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeGenerator.h"
                       ,0x1ef,"(pnodeBlock->nop == knopBlock)","pnodeBlock->nop == knopBlock");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this_01 = pnodeBlock->pnodeLexVars;
  do {
    if (this_01 == (ParseNode *)0x0) {
      return;
    }
    pPVar5 = ParseNode::AsParseNodeVar(this_01);
    this_00 = pPVar5->sym;
    if ((bVar1 & 0xc) == 0) {
      bVar3 = Symbol::NeedsSlotAlloc(this_00,this,funcInfo);
      if (bVar3) goto LAB_00816f99;
    }
    else {
LAB_00816f99:
      Symbol::EnsureScopeSlot(this_00,this,funcInfo);
      ProcessCapturedSym(this,this_00);
    }
    pPVar5 = ParseNode::AsParseNodeVar(this_01);
    this_01 = pPVar5->pnodeNext;
  } while( true );
}

Assistant:

void ByteCodeGenerator::EnsureLetConstScopeSlots(ParseNodeBlock *pnodeBlock, FuncInfo *funcInfo)
{
    bool callsEval = pnodeBlock->GetCallsEval() || pnodeBlock->GetChildCallsEval();
    auto ensureLetConstSlots = ([this, funcInfo, callsEval](ParseNode *pnode)
    {
        Symbol *sym = pnode->AsParseNodeVar()->sym;
        if (callsEval || sym->NeedsSlotAlloc(this, funcInfo))
        {
            sym->EnsureScopeSlot(this, funcInfo);
            this->ProcessCapturedSym(sym);
        }
    });
    IterateBlockScopedVariables(pnodeBlock, ensureLetConstSlots);
}